

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_tree.cpp
# Opt level: O0

void __thiscall
spvtools::opt::DominatorTree::InitializeTree(DominatorTree *this,CFG *cfg,Function *f)

{
  bool bVar1;
  reference ppVar2;
  DominatorTreeNode *pDVar3;
  BasicBlock *local_c8;
  DominatorTreeNode *second;
  DominatorTreeNode **local_a8;
  __normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
  local_a0;
  __normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
  local_98;
  DominatorTreeNode *local_90;
  DominatorTreeNode *first;
  pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*> edge;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
  *__range2;
  vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
  edges;
  BasicBlock *placeholder_start_node;
  const_iterator local_30;
  Function *local_20;
  Function *f_local;
  CFG *cfg_local;
  DominatorTree *this_local;
  
  local_20 = f;
  f_local = (Function *)cfg;
  cfg_local = (CFG *)this;
  ClearTree(this);
  local_30 = Function::cbegin(local_20);
  _placeholder_start_node = Function::cend(local_20);
  bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_true>::operator==
                    (&local_30,
                     (UptrVectorIterator<spvtools::opt::BasicBlock,_true> *)&placeholder_start_node)
  ;
  if (!bVar1) {
    if ((this->postdominator_ & 1U) == 0) {
      local_c8 = CFG::pseudo_entry_block((CFG *)f_local);
    }
    else {
      local_c8 = CFG::pseudo_exit_block((CFG *)f_local);
    }
    edges.
    super__Vector_base<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_c8;
    std::
    vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
    ::vector((vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
              *)&__range2);
    GetDominatorEdges(this,local_20,
                      (BasicBlock *)
                      edges.
                      super__Vector_base<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
                       *)&__range2);
    __end2 = std::
             vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
             ::begin((vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
                      *)&__range2);
    edge.second = (BasicBlock *)
                  std::
                  vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
                  ::end((vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
                         *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_*,_std::vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>_>
                                       *)&edge.second), bVar1) {
      ppVar2 = __gnu_cxx::
               __normal_iterator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_*,_std::vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>_>
               ::operator*(&__end2);
      first = (DominatorTreeNode *)ppVar2->first;
      edge.first = ppVar2->second;
      local_90 = GetOrInsertNode(this,(BasicBlock *)first);
      if ((BasicBlock *)first == edge.first) {
        local_a0._M_current =
             (DominatorTreeNode **)
             std::
             vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
             ::begin(&this->roots_);
        local_a8 = (DominatorTreeNode **)
                   std::
                   vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                   ::end(&this->roots_);
        local_98 = std::
                   find<__gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode**,std::vector<spvtools::opt::DominatorTreeNode*,std::allocator<spvtools::opt::DominatorTreeNode*>>>,spvtools::opt::DominatorTreeNode*>
                             (local_a0,(__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
                                        )local_a8,&local_90);
        second = (DominatorTreeNode *)
                 std::
                 vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                 ::end(&this->roots_);
        bVar1 = __gnu_cxx::operator==
                          (&local_98,
                           (__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>
                            *)&second);
        if (bVar1) {
          std::
          vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
          ::push_back(&this->roots_,&local_90);
        }
      }
      else {
        pDVar3 = GetOrInsertNode(this,edge.first);
        local_90->parent_ = pDVar3;
        std::
        vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
        ::push_back(&pDVar3->children_,&local_90);
      }
      __gnu_cxx::
      __normal_iterator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_*,_std::vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>_>
      ::operator++(&__end2);
    }
    ResetDFNumbering(this);
    std::
    vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
    ::~vector((vector<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*>_>_>
               *)&__range2);
  }
  return;
}

Assistant:

void DominatorTree::InitializeTree(const CFG& cfg, const Function* f) {
  ClearTree();

  // Skip over empty functions.
  if (f->cbegin() == f->cend()) {
    return;
  }

  const BasicBlock* placeholder_start_node =
      postdominator_ ? cfg.pseudo_exit_block() : cfg.pseudo_entry_block();

  // Get the immediate dominator for each node.
  std::vector<std::pair<BasicBlock*, BasicBlock*>> edges;
  GetDominatorEdges(f, placeholder_start_node, &edges);

  // Transform the vector<pair> into the tree structure which we can use to
  // efficiently query dominance.
  for (auto edge : edges) {
    DominatorTreeNode* first = GetOrInsertNode(edge.first);

    if (edge.first == edge.second) {
      if (std::find(roots_.begin(), roots_.end(), first) == roots_.end())
        roots_.push_back(first);
      continue;
    }

    DominatorTreeNode* second = GetOrInsertNode(edge.second);

    first->parent_ = second;
    second->children_.push_back(first);
  }
  ResetDFNumbering();
}